

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_finish(FuncState *fs)

{
  uint *puVar1;
  Proto *pPVar2;
  uint uVar3;
  int dest;
  int target;
  Instruction *pc;
  Proto *p;
  int i;
  FuncState *fs_local;
  
  pPVar2 = fs->f;
  p._4_4_ = 0;
  do {
    if (fs->pc <= p._4_4_) {
      return;
    }
    puVar1 = pPVar2->code + p._4_4_;
    uVar3 = *puVar1 & 0x7f;
    if (uVar3 == 0x38) {
      dest = finaltarget(pPVar2->code,p._4_4_);
      fixjump(fs,p._4_4_,dest);
    }
    else {
      if (1 < uVar3 - 0x45) {
        if ((uVar3 != 0x47 && uVar3 != 0x48) ||
           ((fs->needclose == '\0' && (pPVar2->is_vararg == '\0')))) goto LAB_0012fed5;
        *puVar1 = *puVar1 & 0xffffff80 | 0x46;
      }
      if (fs->needclose != '\0') {
        *puVar1 = *puVar1 & 0xffff7fff | 0x8000;
      }
      if (pPVar2->is_vararg != '\0') {
        *puVar1 = *puVar1 & 0xffffff | (pPVar2->numparams + 1) * 0x1000000;
      }
    }
LAB_0012fed5:
    p._4_4_ = p._4_4_ + 1;
  } while( true );
}

Assistant:

void luaK_finish (FuncState *fs) {
  int i;
  Proto *p = fs->f;
  for (i = 0; i < fs->pc; i++) {
    Instruction *pc = &p->code[i];
    lua_assert(i == 0 || isOT(*(pc - 1)) == isIT(*pc));
    switch (GET_OPCODE(*pc)) {
      case OP_RETURN0: case OP_RETURN1: {
        if (!(fs->needclose || p->is_vararg))
          break;  /* no extra work */
        /* else use OP_RETURN to do the extra work */
        SET_OPCODE(*pc, OP_RETURN);
      }  /* FALLTHROUGH */
      case OP_RETURN: case OP_TAILCALL: {
        if (fs->needclose)
          SETARG_k(*pc, 1);  /* signal that it needs to close */
        if (p->is_vararg)
          SETARG_C(*pc, p->numparams + 1);  /* signal that it is vararg */
        break;
      }
      case OP_JMP: {
        int target = finaltarget(p->code, i);
        fixjump(fs, i, target);
        break;
      }
      default: break;
    }
  }
}